

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astIdentifierReferenceNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t left;
  undefined1 local_a0 [8];
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_32_4_ffdb6493 gcFrame;
  sysbvm_astIdentifierReferenceNode_t **referenceNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&gcFrameRecord.roots,0,0x20);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  local_a0 = (undefined1  [8])0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_a0);
  _Var1 = sysbvm_environment_lookSymbolRecursively
                    (context,arguments[1],*(sysbvm_tuple_t *)(*arguments + 0x28),
                     (sysbvm_tuple_t *)&gcFrameRecord.roots);
  if (_Var1) {
    _Var1 = sysbvm_symbolBinding_isValue(context,(sysbvm_tuple_t)gcFrameRecord.roots);
    if (_Var1) {
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_a0);
      sVar2 = sysbvm_symbolValueBinding_getValue((sysbvm_tuple_t)gcFrameRecord.roots);
      return sVar2;
    }
    _Var1 = sysbvm_symbolBinding_isMacroValue(context,(sysbvm_tuple_t)gcFrameRecord.roots);
    if (_Var1) {
      sVar2 = sysbvm_symbolMacroValueBinding_getExpansion((sysbvm_tuple_t)gcFrameRecord.roots);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_a0);
      sVar2 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,sVar2,arguments[1]);
      return sVar2;
    }
  }
  sVar2 = sysbvm_tuple_printString(context,*(sysbvm_tuple_t *)(*arguments + 0x28));
  left = sysbvm_string_createWithCString(context,"Failed to find symbol binding for ");
  sVar2 = sysbvm_string_concat(context,left,sVar2);
  sysbvm_errorWithMessageTuple(sVar2);
  return 0;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIdentifierReferenceNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astIdentifierReferenceNode_t **referenceNode = (sysbvm_astIdentifierReferenceNode_t**)node;

    struct {
        sysbvm_tuple_t binding;
        sysbvm_tuple_t expansionNode;
        sysbvm_tuple_t symbolString;
        sysbvm_tuple_t errorMessage;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*referenceNode)->super.sourcePosition);

    if(sysbvm_environment_lookSymbolRecursively(context, *environment, (*referenceNode)->value, &gcFrame.binding))
    {
        if(sysbvm_symbolBinding_isValue(context, gcFrame.binding))
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            return sysbvm_symbolValueBinding_getValue(gcFrame.binding);
        }
        else if(sysbvm_symbolBinding_isMacroValue(context, gcFrame.binding))
        {
            gcFrame.expansionNode = sysbvm_symbolMacroValueBinding_getExpansion(gcFrame.binding);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expansionNode, *environment);
        }
    }

    gcFrame.symbolString = sysbvm_tuple_printString(context, (*referenceNode)->value);
    gcFrame.errorMessage = sysbvm_string_concat(context, sysbvm_string_createWithCString(context, "Failed to find symbol binding for "), gcFrame.symbolString);
    sysbvm_errorWithMessageTuple(gcFrame.errorMessage);
    return SYSBVM_NULL_TUPLE;
}